

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fs_read_file_eof(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  __off64_t _Var6;
  uv_buf_t *bufs;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  uv_buf_t uVar11;
  char acStack_e2 [2];
  uv_loop_t *puStack_e0;
  uv_buf_t uStack_58;
  uv_buf_t uStack_48;
  uv_loop_t *puStack_30;
  
  unlink("test_file");
  loop = uv_default_loop();
  iVar3 = 0;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_read_file_eof_cold_1();
LAB_001558db:
    fs_read_file_eof_cold_2();
LAB_001558e0:
    fs_read_file_eof_cold_3();
LAB_001558e5:
    fs_read_file_eof_cold_4();
LAB_001558ea:
    fs_read_file_eof_cold_5();
LAB_001558ef:
    fs_read_file_eof_cold_6();
LAB_001558f4:
    fs_read_file_eof_cold_7();
LAB_001558f9:
    fs_read_file_eof_cold_8();
LAB_001558fe:
    fs_read_file_eof_cold_9();
LAB_00155903:
    fs_read_file_eof_cold_10();
LAB_00155908:
    fs_read_file_eof_cold_11();
LAB_0015590d:
    fs_read_file_eof_cold_12();
LAB_00155912:
    fs_read_file_eof_cold_13();
LAB_00155917:
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001558db;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar3 = 0;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001558e0;
    if (write_req.result < 0) goto LAB_001558e5;
    uv_fs_req_cleanup(&write_req);
    iVar3 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001558ea;
    if (close_req.result != 0) goto LAB_001558ef;
    uv_fs_req_cleanup(&close_req);
    iVar3 = 0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001558f4;
    if (open_req1.result._4_4_ < 0) goto LAB_001558f9;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar11 = uv_buf_init(buf,0x20);
    iVar3 = 0;
    iov = uVar11;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_001558fe;
    if (read_req.result < 0) goto LAB_00155903;
    iVar3 = 0x2fbca0;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00155908;
    uv_fs_req_cleanup(&read_req);
    uVar11 = uv_buf_init(buf,0x20);
    iVar3 = 0;
    iov = uVar11;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,read_req.result,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015590d;
    if (read_req.result != 0) goto LAB_00155912;
    uv_fs_req_cleanup(&read_req);
    iVar3 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155917;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_read_file_eof_cold_15();
  fs_write_multiple_bufs(iVar3);
  fs_write_multiple_bufs(iVar3);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_30 = puVar4;
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar3 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00155dfc:
    fs_write_multiple_bufs_cold_2();
LAB_00155e01:
    fs_write_multiple_bufs_cold_3();
LAB_00155e06:
    fs_write_multiple_bufs_cold_4();
LAB_00155e0b:
    fs_write_multiple_bufs_cold_5();
LAB_00155e10:
    fs_write_multiple_bufs_cold_6();
LAB_00155e15:
    fs_write_multiple_bufs_cold_7();
LAB_00155e1a:
    fs_write_multiple_bufs_cold_8();
LAB_00155e1f:
    fs_write_multiple_bufs_cold_9();
LAB_00155e24:
    fs_write_multiple_bufs_cold_10();
LAB_00155e29:
    fs_write_multiple_bufs_cold_11();
LAB_00155e2e:
    fs_write_multiple_bufs_cold_12();
LAB_00155e33:
    fs_write_multiple_bufs_cold_13();
LAB_00155e38:
    fs_write_multiple_bufs_cold_14();
LAB_00155e3d:
    fs_write_multiple_bufs_cold_15();
LAB_00155e42:
    fs_write_multiple_bufs_cold_16();
LAB_00155e47:
    fs_write_multiple_bufs_cold_19();
LAB_00155e4c:
    fs_write_multiple_bufs_cold_20();
LAB_00155e51:
    fs_write_multiple_bufs_cold_21();
LAB_00155e56:
    fs_write_multiple_bufs_cold_22();
LAB_00155e5b:
    fs_write_multiple_bufs_cold_23();
LAB_00155e60:
    fs_write_multiple_bufs_cold_24();
LAB_00155e65:
    fs_write_multiple_bufs_cold_25();
LAB_00155e6a:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00155dfc;
    uv_fs_req_cleanup(&open_req1);
    uStack_58 = uv_buf_init(test_buf,0xd);
    uStack_48 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&uStack_58,2,0,
                        (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155e01;
    if (write_req.result < 0) goto LAB_00155e06;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00155e0b;
    if (close_req.result != 0) goto LAB_00155e10;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155e15;
    if (open_req1.result._4_4_ < 0) goto LAB_00155e1a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_58 = uv_buf_init(buf,0xd);
    uStack_48 = uv_buf_init(buf2,0xf);
    iVar2 = (uv_file)open_req1.result;
    _Var6 = lseek64((uv_file)open_req1.result,0,1);
    if (_Var6 != 0) goto LAB_00155e1f;
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_58,2,-1,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155e24;
    if (read_req.result != 0x1c) goto LAB_00155e29;
    iVar2 = 0x2fbca0;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00155e2e;
    iVar2 = 0x2fd090;
    iVar3 = strcmp(buf2,test_buf2);
    if (iVar3 != 0) goto LAB_00155e33;
    uv_fs_req_cleanup(&read_req);
    uVar11 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar11;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar3 != 0) goto LAB_00155e38;
    if (read_req.result != 0) goto LAB_00155e3d;
    uv_fs_req_cleanup(&read_req);
    uStack_58 = uv_buf_init(buf,0xd);
    uStack_48 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_58,2,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155e42;
    if (read_req.result == 0x1c) {
LAB_00155cfa:
      iVar2 = 0x2fbca0;
      iVar3 = strcmp(buf,test_buf);
      if (iVar3 != 0) goto LAB_00155e47;
      iVar2 = 0x2fd090;
      iVar3 = strcmp(buf2,test_buf2);
      if (iVar3 != 0) goto LAB_00155e4c;
      uv_fs_req_cleanup(&read_req);
      uVar11 = uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar11;
      iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0x1c,
                         (uv_fs_cb)0x0);
      if (iVar3 != 0) goto LAB_00155e51;
      if (read_req.result != 0) goto LAB_00155e56;
      uv_fs_req_cleanup(&read_req);
      iVar2 = 0;
      iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar3 != 0) goto LAB_00155e5b;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_00155e60;
    }
    if (read_req.result != 0xd) goto LAB_00155e65;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_48,1,
                       read_req.result,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00155e6a;
    if (read_req.result == 0xf) goto LAB_00155cfa;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_001561ec:
    fs_write_alotof_bufs_cold_18();
LAB_001561f1:
    fs_write_alotof_bufs_cold_1();
LAB_001561f6:
    fs_write_alotof_bufs_cold_2();
LAB_001561fb:
    fs_write_alotof_bufs_cold_3();
LAB_00156200:
    fs_write_alotof_bufs_cold_4();
LAB_00156205:
    fs_write_alotof_bufs_cold_17();
LAB_0015620a:
    fs_write_alotof_bufs_cold_5();
LAB_0015620f:
    fs_write_alotof_bufs_cold_6();
LAB_00156214:
    fs_write_alotof_bufs_cold_7();
LAB_00156219:
    fs_write_alotof_bufs_cold_8();
LAB_0015621e:
    fs_write_alotof_bufs_cold_9();
LAB_00156223:
    fs_write_alotof_bufs_cold_10();
LAB_00156228:
    fs_write_alotof_bufs_cold_12();
LAB_0015622d:
    fs_write_alotof_bufs_cold_13();
LAB_00156232:
    fs_write_alotof_bufs_cold_14();
LAB_00156237:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001561f1;
    if (open_req1.result._4_4_ < 0) goto LAB_001561f6;
    uv_fs_req_cleanup(&open_req1);
    lVar9 = 8;
    do {
      uVar11 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar9 + -8) = uVar11.base;
      *(size_t *)((long)&bufs->base + lVar9) = uVar11.len;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001561fb;
    if (write_req.result != 0xac67d) goto LAB_00156200;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pcVar7 = (char *)malloc(0xac67d);
    if (pcVar7 == (char *)0x0) goto LAB_00156205;
    lVar9 = 8;
    pcVar10 = pcVar7;
    do {
      uVar11 = uv_buf_init(pcVar10,0xd);
      *(char **)((long)bufs + lVar9 + -8) = uVar11.base;
      *(size_t *)((long)&bufs->base + lVar9) = uVar11.len;
      lVar9 = lVar9 + 0x10;
      pcVar10 = pcVar10 + 0xd;
    } while (lVar9 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015620a;
    if (close_req.result != 0) goto LAB_0015620f;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_00156214;
    if (open_req1.result._4_4_ < 0) goto LAB_00156219;
    uv_fs_req_cleanup(&open_req1);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015621e;
    if (read_req.result != 0x3400) goto LAB_00156223;
    lVar9 = 0;
    do {
      pcVar10 = pcVar7 + lVar9;
      iVar3 = strncmp(pcVar10,test_buf,0xd);
      iVar2 = (int)pcVar10;
      if (iVar3 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_001561ec;
      }
      lVar9 = lVar9 + 0xd;
    } while (lVar9 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar7);
    iVar2 = (uv_file)open_req1.result;
    _Var6 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_00156228;
    uVar11 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar11;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar3 != 0) goto LAB_0015622d;
    if (read_req.result != 0) goto LAB_00156232;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00156237;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_e0 = (uv_loop_t *)0x1562a0;
  unlink("test_file");
  puStack_e0 = (uv_loop_t *)0x1562a5;
  loop = uv_default_loop();
  puStack_e0 = (uv_loop_t *)0x1562b6;
  puVar5 = (uv_loop_t *)malloc(0xd4310);
  if (puVar5 == (uv_loop_t *)0x0) {
LAB_001565fb:
    puVar5 = puVar4;
    puStack_e0 = (uv_loop_t *)0x156600;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00156600:
    puStack_e0 = (uv_loop_t *)0x156605;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00156605:
    puStack_e0 = (uv_loop_t *)0x15660a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015660a:
    puStack_e0 = (uv_loop_t *)0x15660f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0015660f:
    puStack_e0 = (uv_loop_t *)0x156614;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00156614:
    puStack_e0 = (uv_loop_t *)0x156619;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00156619:
    puStack_e0 = (uv_loop_t *)0x15661e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0015661e:
    puStack_e0 = (uv_loop_t *)0x156623;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00156623:
    puStack_e0 = (uv_loop_t *)0x156628;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00156628:
    puStack_e0 = (uv_loop_t *)0x15662d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0015662d:
    puStack_e0 = (uv_loop_t *)0x156632;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00156632:
    puStack_e0 = (uv_loop_t *)0x156637;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00156637:
    puStack_e0 = (uv_loop_t *)0x15663c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0015663c:
    puStack_e0 = (uv_loop_t *)0x156641;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00156641:
    puStack_e0 = (uv_loop_t *)0x156646;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_e0 = (uv_loop_t *)0x1562e5;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156600;
    if (open_req1.result._4_4_ < 0) goto LAB_00156605;
    puStack_e0 = (uv_loop_t *)0x156307;
    uv_fs_req_cleanup(&open_req1);
    puStack_e0 = (uv_loop_t *)0x156318;
    uVar11 = uv_buf_init("0123456789",10);
    puStack_e0 = (uv_loop_t *)0x156356;
    iov = uVar11;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015660a;
    if (write_req.result != 10) goto LAB_0015660f;
    puStack_e0 = (uv_loop_t *)0x156379;
    uv_fs_req_cleanup(&write_req);
    lVar9 = 8;
    do {
      puStack_e0 = (uv_loop_t *)0x156393;
      uVar11 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar5->handle_queue + lVar9 + -0x18) = uVar11.base;
      *(size_t *)((long)puVar5->handle_queue + lVar9 + -0x10) = uVar11.len;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0xd4318);
    puStack_e0 = (uv_loop_t *)0x1563d4;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156614;
    if (write_req.result != 0xac67d) goto LAB_00156619;
    puStack_e0 = (uv_loop_t *)0x1563f9;
    uv_fs_req_cleanup(&write_req);
    puStack_e0 = (uv_loop_t *)0x156403;
    pcVar7 = (char *)malloc(0xac67d);
    if (pcVar7 == (char *)0x0) goto LAB_0015661e;
    lVar9 = 8;
    pcVar10 = pcVar7;
    do {
      puStack_e0 = (uv_loop_t *)0x156425;
      uVar11 = uv_buf_init(pcVar10,0xd);
      *(char **)((long)puVar5->handle_queue + lVar9 + -0x18) = uVar11.base;
      *(size_t *)((long)puVar5->handle_queue + lVar9 + -0x10) = uVar11.len;
      lVar9 = lVar9 + 0x10;
      pcVar10 = pcVar10 + 0xd;
    } while (lVar9 != 0xd4318);
    puStack_e0 = (uv_loop_t *)0x15646a;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156623;
    lVar9 = 0xd;
    if (iVar2 != 0xd) {
      lVar9 = 0x3400;
    }
    if (read_req.result != lVar9) goto LAB_00156628;
    pcVar10 = pcVar7;
    uVar8 = 0;
    do {
      puStack_e0 = (uv_loop_t *)0x1564af;
      iVar3 = strncmp(pcVar10,test_buf,0xd);
      if (iVar3 != 0) {
        puStack_e0 = (uv_loop_t *)0x1565fb;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar4 = puVar5;
        goto LAB_001565fb;
      }
      if (iVar2 == 0xd) break;
      pcVar10 = pcVar10 + 0xd;
      bVar1 = uVar8 < 0x3ff;
      uVar8 = uVar8 + 1;
    } while (bVar1);
    puStack_e0 = (uv_loop_t *)0x1564dc;
    uv_fs_req_cleanup(&read_req);
    puStack_e0 = (uv_loop_t *)0x1564e4;
    free(pcVar7);
    puStack_e0 = (uv_loop_t *)0x1564fb;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015662d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00156632;
    puStack_e0 = (uv_loop_t *)0x15652b;
    uv_fs_req_cleanup(&stat_req);
    puStack_e0 = (uv_loop_t *)0x15653c;
    uVar11 = uv_buf_init(buf,0x20);
    puStack_e0 = (uv_loop_t *)0x15657e;
    iov = uVar11;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156637;
    if (read_req.result != 0) goto LAB_0015663c;
    puStack_e0 = (uv_loop_t *)0x1565a0;
    uv_fs_req_cleanup(&read_req);
    puStack_e0 = (uv_loop_t *)0x1565b6;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156641;
    if (close_req.result == 0) {
      puStack_e0 = (uv_loop_t *)0x1565d4;
      uv_fs_req_cleanup(&close_req);
      puStack_e0 = (uv_loop_t *)0x1565e0;
      unlink("test_file");
      free(puVar5);
      return;
    }
  }
  puStack_e0 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_e0 = puVar5;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_001567bd;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001567c2;
    uv_fs_req_cleanup(&open_req1);
    uVar11 = uv_buf_init(acStack_e2,2);
    iov = uVar11;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_001567c7;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_001567d1;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_001567bd:
    run_test_fs_read_dir_cold_2();
LAB_001567c2:
    run_test_fs_read_dir_cold_3();
LAB_001567c7:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001567d1:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_read_file_eof(int add_flags) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  RETURN_SKIP("Cygwin pread at EOF may (incorrectly) return data!");
#endif
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
      NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(read_req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1,
                 read_req.result, NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}